

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cute_reporter.c
# Opt level: O3

void cute_finish_test(TestReporter *reporter,char *filename,int line,char *message)

{
  undefined8 *puVar1;
  char *pcVar2;
  
  puVar1 = (undefined8 *)reporter->memo;
  pcVar2 = get_current_from_breadcrumb(reporter->breadcrumb);
  reporter_finish_test(reporter,filename,line,message);
  if (*(int *)(puVar1 + 2) == reporter->exceptions + reporter->failures) {
    (*(code *)*puVar1)("#success %s OK\n",pcVar2);
    return;
  }
  return;
}

Assistant:

static void cute_finish_test(TestReporter *reporter, const char *filename, int line, const char *message) {
    CuteMemo *memo = (CuteMemo *) reporter->memo;
    const char *name = get_current_from_breadcrumb((CgreenBreadcrumb *)reporter->breadcrumb);

    reporter_finish_test(reporter, filename, line, message);
    if (memo->error_count == reporter->failures + reporter->exceptions) {
        memo->printer("#success %s OK\n", name);
    }
}